

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::AssertionResult::~AssertionResult(AssertionResult *this)

{
  AssertionResultData::~AssertionResultData((AssertionResultData *)this);
  return;
}

Assistant:

AssertionResult() = delete;